

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O0

map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
* __thiscall
Board::get_possible_moves
          (map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
           *__return_storage_ptr__,Board *this,Color color)

{
  bool bVar1;
  int iVar2;
  shared_ptr<Piece> *__a;
  __shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *p_Var3;
  element_type *peVar4;
  mapped_type *this_00;
  bool bVar5;
  Point local_a0;
  Point local_9c;
  undefined1 local_98 [8];
  set<Point,_std::less<Point>,_std::allocator<Point>_> piece_possible_moves;
  Point local_58;
  short local_54;
  short local_52;
  undefined1 local_50 [4];
  dimension j;
  dimension i;
  map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
  possible_moves;
  Color color_local;
  Board *this_local;
  
  possible_moves._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ = color & WHITE;
  std::
  map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
  ::map((map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
         *)local_50);
  for (local_52 = 0; local_52 < 8; local_52 = local_52 + 1) {
    for (local_54 = 0; local_54 < 8; local_54 = local_54 + 1) {
      Point::Point(&local_58,local_54,local_52);
      __a = TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[](&this->m_board,&local_58);
      bVar1 = std::operator==(__a,(nullptr_t)0x0);
      bVar5 = true;
      if (!bVar1) {
        Point::Point((Point *)&piece_possible_moves._M_t._M_impl.super__Rb_tree_header._M_node_count
                     ,local_54,local_52);
        p_Var3 = (__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[]
                           (&this->m_board,
                            (Point *)&piece_possible_moves._M_t._M_impl.super__Rb_tree_header.
                                      _M_node_count);
        peVar4 = std::__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        iVar2 = (*peVar4->_vptr_Piece[4])();
        bVar5 = ((Color)iVar2 & WHITE) !=
                (possible_moves._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & WHITE);
      }
      if (!bVar5) {
        Point::Point(&local_9c,local_54,local_52);
        p_Var3 = (__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 TwoDimensionalVector<std::shared_ptr<Piece>_>::operator[](&this->m_board,&local_9c)
        ;
        peVar4 = std::__shared_ptr_access<Piece,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(p_Var3);
        (**peVar4->_vptr_Piece)(local_98,peVar4,this);
        bVar5 = std::set<Point,_std::less<Point>,_std::allocator<Point>_>::empty
                          ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_98);
        if (!bVar5) {
          Point::Point(&local_a0,local_54,local_52);
          this_00 = std::
                    map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
                    ::operator[]((map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
                                  *)local_50,&local_a0);
          std::set<Point,_std::less<Point>,_std::allocator<Point>_>::operator=
                    (this_00,(set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_98);
        }
        std::set<Point,_std::less<Point>,_std::allocator<Point>_>::~set
                  ((set<Point,_std::less<Point>,_std::allocator<Point>_> *)local_98);
      }
    }
  }
  std::
  map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
  ::map(__return_storage_ptr__,
        (map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
         *)local_50);
  std::
  map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
  ::~map((map<Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>,_std::less<Point>,_std::allocator<std::pair<const_Point,_std::set<Point,_std::less<Point>,_std::allocator<Point>_>_>_>_>
          *)local_50);
  return __return_storage_ptr__;
}

Assistant:

map<Point, set<Point>> Board::get_possible_moves(Color color) const {
    map<Point, set<Point>> possible_moves;

    for (dimension i = 0; i < SIZE; i++) {
        for (dimension j = 0; j < SIZE; j++) {
            if ((m_board[{j, i}] == nullptr) || (m_board[{j, i}]->get_color() != color)) continue;
            auto piece_possible_moves = m_board[{j, i}]->get_possible_positions(m_board);
            if (!piece_possible_moves.empty()) {
                possible_moves[{j, i}] = piece_possible_moves;
            }
        }
    }

    return move(possible_moves);
}